

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O0

void __thiscall tinyxml2::DynArray<char,_20>::EnsureCapacity(DynArray<char,_20> *this,int cap)

{
  char *__dest;
  ulong uVar1;
  char *newMem;
  int newAllocated;
  int cap_local;
  DynArray<char,_20> *this_local;
  
  if (this->_allocated < cap) {
    uVar1 = (ulong)(cap << 1);
    if ((long)uVar1 < 0) {
      uVar1 = 0xffffffffffffffff;
    }
    __dest = (char *)operator_new__(uVar1);
    memcpy(__dest,this->_mem,(long)this->_size);
    if ((this->_mem != this->_pool) && (this->_mem != (char *)0x0)) {
      operator_delete__(this->_mem);
    }
    this->_mem = __dest;
    this->_allocated = cap << 1;
  }
  return;
}

Assistant:

void EnsureCapacity( int cap ) {
        TIXMLASSERT( cap > 0 );
        if ( cap > _allocated ) {
            TIXMLASSERT( cap <= INT_MAX / 2 );
            const int newAllocated = cap * 2;
            T* newMem = new T[newAllocated];
            TIXMLASSERT( newAllocated >= _size );
            memcpy( newMem, _mem, sizeof(T)*_size );	// warning: not using constructors, only works for PODs
            if ( _mem != _pool ) {
                delete [] _mem;
            }
            _mem = newMem;
            _allocated = newAllocated;
        }
    }